

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::
SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
::
emplace_back<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
          (SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
           *this,span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>
                 *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  size_type sVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  ulong capacity;
  
  puVar9 = (undefined8 *)(*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    if (*(long *)(this + 8) == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = *(long *)(this + 8) + 1;
    uVar1 = *(ulong *)(this + 0x10);
    if (capacity < uVar1 * 2) {
      capacity = uVar1 * 2;
    }
    if (0x7fffffffffffffff - uVar1 < uVar1) {
      capacity = 0x7fffffffffffffff;
    }
    lVar10 = (long)puVar9 - *(long *)this;
    puVar6 = (undefined8 *)detail::allocArray(capacity,0x10);
    sVar3 = args->size_;
    *(undefined8 *)((long)puVar6 + lVar10) = args->data_;
    ((undefined8 *)((long)puVar6 + lVar10))[1] = sVar3;
    puVar7 = *(undefined8 **)this;
    lVar5 = *(long *)(this + 8);
    puVar2 = puVar6;
    if (puVar7 + lVar5 * 2 == puVar9) {
      if (lVar5 != 0) {
        lVar8 = 0;
        do {
          uVar4 = ((undefined8 *)((long)puVar7 + lVar8))[1];
          *(undefined8 *)((long)puVar6 + lVar8) = *(undefined8 *)((long)puVar7 + lVar8);
          ((undefined8 *)((long)puVar6 + lVar8))[1] = uVar4;
          lVar8 = lVar8 + 0x10;
        } while (lVar5 * 0x10 != lVar8);
      }
    }
    else {
      for (; puVar7 != puVar9; puVar7 = puVar7 + 2) {
        uVar4 = puVar7[1];
        *puVar2 = *puVar7;
        puVar2[1] = uVar4;
        puVar2 = puVar2 + 2;
      }
      puVar7 = (undefined8 *)(*(long *)(this + 8) * 0x10 + *(long *)this);
      if (puVar7 != puVar9) {
        puVar2 = (undefined8 *)((long)puVar6 + lVar10);
        do {
          uVar4 = puVar9[1];
          puVar2[2] = *puVar9;
          puVar2[3] = uVar4;
          puVar9 = puVar9 + 2;
          puVar2 = puVar2 + 2;
        } while (puVar9 != puVar7);
      }
    }
    if (*(SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
          **)this != this + 0x18) {
      free(*(SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
             **)this);
    }
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = capacity;
    *(undefined8 **)this = puVar6;
    return (reference)((long)puVar6 + lVar10);
  }
  sVar3 = args->size_;
  *puVar9 = args->data_;
  puVar9[1] = sVar3;
  lVar5 = *(long *)(this + 8) + 1;
  *(long *)(this + 8) = lVar5;
  if (lVar5 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<nonstd::span_lite::span<const slang::ast::CoverageBinSymbol::TransRangeList>>::back() [T = nonstd::span_lite::span<const slang::ast::CoverageBinSymbol::TransRangeList>]"
              );
  }
  return (reference)(lVar5 * 0x10 + *(long *)this + -0x10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }